

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::ConfigurePresetsHelper
               (vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::ConfigurePreset> *in_RCX;
  Object<cmCMakePresetsGraph::ConfigurePreset> local_88;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
  *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 cmCMakePresetsErrors::INVALID_PRESETS);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
                (&local_88,
                 (Object<cmCMakePresetsGraph::ConfigurePreset> *)
                 (anonymous_namespace)::ConfigurePresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::ConfigurePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>>
                (&ConfigurePresetsHelper::helper,(cmJSONHelperBuilder *)&local_40,
                 (ErrorGenerator *)&local_88,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&local_88);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,&ConfigurePresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&ConfigurePresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                        *)value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool ConfigurePresetsHelper(std::vector<ConfigurePreset>& out,
                            const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<ConfigurePreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, ConfigurePresetHelper);

  return helper(out, value, state);
}